

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

small_vector<float,_4UL,_0UL,_std::allocator<float>_> * __thiscall
itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator=
          (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *this,
          small_vector<float,_4UL,_0UL,_std::allocator<float>_> *v)

{
  float *pfVar1;
  small_vector<float,_4UL,_0UL,_std::allocator<float>_> *in_RSI;
  small_vector<float,_4UL,_0UL,_std::allocator<float>_> *in_RDI;
  pointer p;
  size_t in_stack_ffffffffffffffe0;
  small_vector<float,_4UL,_0UL,_std::allocator<float>_> *this_00;
  small_vector<float,_4UL,_0UL,_std::allocator<float>_> *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    clear(in_RDI);
    size(in_RSI);
    pfVar1 = choose_data(in_RSI,in_stack_ffffffffffffffe0);
    in_RDI->m_end = pfVar1;
    in_RDI->m_begin = pfVar1;
    for (this_00 = (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)in_RSI->m_begin;
        this_00 != (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)in_RSI->m_end;
        this_00 = (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)&this_00->field_0x4) {
      get_alloc(in_RDI);
      std::allocator_traits<std::allocator<float>>::construct<float,float&>
                ((allocator_type *)this_00,(float *)in_RDI,(float *)0x198106);
      in_RDI->m_end = in_RDI->m_end + 1;
    }
    update_capacity(this_00);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

small_vector& operator=(const small_vector& v)
    {
        if (this == &v)
        {
            // prevent self usurp
            return *this;
        }

        clear();

        m_begin = m_end = choose_data(v.size());

        for (auto p = v.m_begin; p != v.m_end; ++p)
        {
            atraits::construct(get_alloc(), m_end, *p);
            ++m_end;
        }

        update_capacity();

        return *this;
    }